

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderbuffers.cpp
# Opt level: O0

GLuint __thiscall
FGLRenderBuffers::CreateRenderBuffer
          (FGLRenderBuffers *this,FString *name,GLuint format,int width,int height)

{
  GLuint local_28;
  int local_24;
  GLuint handle;
  int height_local;
  int width_local;
  GLuint format_local;
  FString *name_local;
  FGLRenderBuffers *this_local;
  
  local_28 = 0;
  local_24 = height;
  handle = width;
  height_local = format;
  _width_local = name;
  name_local = (FString *)this;
  (*_ptrc_glGenRenderbuffers)(1,&local_28);
  (*_ptrc_glBindRenderbuffer)(0x8d41,local_28);
  FGLDebug::LabelObject(0x8d41,local_28,_width_local);
  (*_ptrc_glRenderbufferStorage)(0x8d41,height_local,handle,local_24);
  return local_28;
}

Assistant:

GLuint FGLRenderBuffers::CreateRenderBuffer(const FString &name, GLuint format, int width, int height)
{
	GLuint handle = 0;
	glGenRenderbuffers(1, &handle);
	glBindRenderbuffer(GL_RENDERBUFFER, handle);
	FGLDebug::LabelObject(GL_RENDERBUFFER, handle, name);
	glRenderbufferStorage(GL_RENDERBUFFER, format, width, height);
	return handle;
}